

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint *ptr;
  RepeatedField<unsigned_int> *array;
  int i;
  int index;
  
  if (*field != 0) {
    io::CodedOutputStream::WriteVarint32(output,md->tag);
    io::CodedOutputStream::WriteVarint32(output,*(uint32 *)((long)field + 0x10));
    for (index = 0; index < *field; index = index + 1) {
      ptr = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      PrimitiveTypeHelper<7>::Serialize(ptr,output);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}